

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

void safe_strcpy(char *dst,size_t dstlen,char *src)

{
  char *in_RDX;
  long in_RSI;
  char *in_RDI;
  size_t copylen;
  size_t local_20;
  char *local_18;
  
  if (((in_RDI != (char *)0x0) && (in_RSI != 0)) && (in_RDI != in_RDX)) {
    local_18 = in_RDX;
    if (in_RDX == (char *)0x0) {
      local_18 = "";
    }
    local_20 = strlen(local_18);
    if (in_RSI - 1U < local_20) {
      local_20 = in_RSI - 1;
    }
    memcpy(in_RDI,local_18,local_20);
    in_RDI[local_20] = '\0';
  }
  return;
}

Assistant:

static void
safe_strcpy(char *dst, size_t dstlen, const char *src)
{
    size_t copylen;

    /* do nothing if there's no output buffer */
    if (dst == 0 || dstlen == 0)
        return;

    /* do nothing if the source and destination buffers are the same */
    if (dst == src)
        return;

    /* use an empty string if given a null string */
    if (src == 0)
        src = "";

    /* 
     *   figure the copy length - use the smaller of the actual string size
     *   or the available buffer size, minus one for the null terminator 
     */
    copylen = strlen(src);
    if (copylen > dstlen - 1)
        copylen = dstlen - 1;

    /* copy the string (or as much as we can) */
    memcpy(dst, src, copylen);

    /* null-terminate it */
    dst[copylen] = '\0';
}